

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tokens_b(AV1_COMP *cpi,MACROBLOCK *x,aom_writer *w,TokenExtra **tok,TokenExtra *tok_end)

{
  int iVar1;
  AV1_COMMON *in_RCX;
  TokenExtra *in_RDX;
  MB_MODE_INFO *unaff_RBX;
  TokenExtra **in_RSI;
  aom_writer *in_RDI;
  MACROBLOCK *in_R8;
  MACROBLOCK *unaff_R14;
  AV1_COMMON *unaff_retaddr;
  int plane;
  int col;
  int row;
  int num_planes;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  TOKEN_STATS token_stats;
  int num_4x4_h;
  int num_4x4_w;
  int block [3];
  int is_inter;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_94;
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  TOKEN_STATS local_70;
  uint local_6c;
  uint local_68;
  undefined1 local_64 [12];
  int local_58;
  byte local_51;
  byte *local_50;
  TokenExtra **ppTVar2;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)&in_RDI[0x1122].ec;
  ppTVar2 = in_RSI + 0x34;
  local_50 = *(byte **)in_RSI[0x40b];
  local_51 = *local_50;
  local_58 = is_inter_block((MB_MODE_INFO *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (local_58 == 0) {
    av1_write_intra_coeffs_mb(in_RCX,in_R8,(aom_writer *)cm_00,(BLOCK_SIZE)((ulong)ppTVar2 >> 0x38))
    ;
  }
  else {
    memset(local_64,0,0xc);
    local_68 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [local_51];
    local_6c = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [local_51];
    init_token_stats(&local_70);
    if ((int)local_68 < 0x10) {
      local_90 = local_68;
    }
    else {
      local_90 = 0x10;
    }
    if ((int)local_6c < 0x10) {
      local_94 = local_6c;
    }
    else {
      local_94 = 0x10;
    }
    iVar1 = av1_num_planes(cm_00);
    for (local_84 = 0; local_84 < (int)local_6c; local_84 = local_94 + local_84) {
      for (local_88 = 0; local_88 < (int)local_68; local_88 = local_90 + local_88) {
        local_8c = 0;
        while ((local_8c < iVar1 && ((local_8c == 0 || ((*(byte *)((long)ppTVar2 + 0xc) & 1) != 0)))
               )) {
          write_inter_txb_coeff
                    (unaff_retaddr,unaff_R14,unaff_RBX,in_RDI,in_RSI,in_RDX,_col,num_planes,
                     mu_blocks_wide,_token_stats,num_4x4_w);
          local_8c = local_8c + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_tokens_b(AV1_COMP *cpi, MACROBLOCK *const x,
                                  aom_writer *w, const TokenExtra **tok,
                                  const TokenExtra *const tok_end) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;

  assert(!mbmi->skip_txfm);

  const int is_inter = is_inter_block(mbmi);
  if (!is_inter) {
    av1_write_intra_coeffs_mb(cm, x, w, bsize);
  } else {
    int block[MAX_MB_PLANE] = { 0 };
    assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                         xd->plane[0].subsampling_y));
    const int num_4x4_w = mi_size_wide[bsize];
    const int num_4x4_h = mi_size_high[bsize];
    TOKEN_STATS token_stats;
    init_token_stats(&token_stats);

    const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
    assert(max_unit_bsize == get_plane_block_size(BLOCK_64X64,
                                                  xd->plane[0].subsampling_x,
                                                  xd->plane[0].subsampling_y));
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(num_4x4_w, mu_blocks_wide);
    mu_blocks_high = AOMMIN(num_4x4_h, mu_blocks_high);

    const int num_planes = av1_num_planes(cm);
    for (int row = 0; row < num_4x4_h; row += mu_blocks_high) {
      for (int col = 0; col < num_4x4_w; col += mu_blocks_wide) {
        for (int plane = 0; plane < num_planes; ++plane) {
          if (plane && !xd->is_chroma_ref) break;
          write_inter_txb_coeff(cm, x, mbmi, w, tok, tok_end, &token_stats, row,
                                col, &block[plane], plane);
        }
      }
    }
#if CONFIG_RD_DEBUG
    for (int plane = 0; plane < num_planes; ++plane) {
      if (mbmi->bsize >= BLOCK_8X8 &&
          rd_token_stats_mismatch(&mbmi->rd_stats, &token_stats, plane)) {
        dump_mode_info(mbmi);
        assert(0);
      }
    }
#endif  // CONFIG_RD_DEBUG
  }
}